

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Int(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
      *this,int i)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  uint16_t uVar2;
  
  pGVar1 = internal::Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                     (&this->stack_,1);
  (pGVar1->data_).s.str = (Ch *)0x0;
  *(long *)&pGVar1->data_ = (long)i;
  uVar2 = 0xb6;
  if (-1 < i) {
    uVar2 = 0x1f6;
  }
  (pGVar1->data_).f.flags = uVar2;
  return true;
}

Assistant:

bool Int(int i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }